

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NortekDVL.cpp
# Opt level: O1

void * NortekDVLThread(void *pParam)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  char *__s;
  CHRONO chrono_period;
  char szTemp [256];
  NORTEKDVL nortekdvl;
  NMEADATA nmeadata;
  char szSaveFilePath [256];
  double local_c28;
  double local_c20;
  interval local_c18;
  int local_c00;
  int local_bfc;
  interval local_bf8;
  interval local_be0;
  timespec local_bc8;
  double local_bb8;
  double dStack_bb0;
  double local_ba8;
  double dStack_ba0;
  timespec local_b98;
  int local_b88;
  double local_b80;
  char local_b78 [256];
  NORTEKDVL local_a78;
  NMEADATA local_510;
  char local_138 [264];
  
  memset(&local_a78,0,0x568);
  memset(&local_510,0,0x3d8);
  iVar4 = clock_getres(4,&local_b98);
  if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_bc8), iVar4 == 0)) {
    local_b88 = 0;
    local_bb8 = 0.0;
    dStack_bb0 = 0.0;
    local_ba8 = 0.0;
    dStack_ba0 = 0.0;
  }
  local_c00 = 100;
  __s = "NortekDVL disconnection failed.";
  bVar2 = false;
  local_bfc = 0;
  do {
    while( true ) {
      if (local_b88 == 0) {
        clock_gettime(4,(timespec *)&local_c18);
        local_bb8 = local_c18.inf;
        dStack_bb0 = local_c18.sup;
        local_c18.inf =
             (double)(((long)local_c18.inf + (long)local_ba8 +
                      ((long)local_c18.sup + (long)dStack_ba0) / 1000000000) - local_bc8.tv_sec);
        local_c18.sup =
             (double)(((long)local_c18.sup + (long)dStack_ba0) % 1000000000 - local_bc8.tv_nsec);
        if ((long)local_c18.sup < 0) {
          local_c18.inf = (double)((long)local_c18.inf + (long)local_c18.sup / 1000000000 + -1);
          local_c18.sup = (double)((long)local_c18.sup % 1000000000 + 1000000000);
        }
        local_ba8 = local_c18.inf;
        dStack_ba0 = local_c18.sup;
      }
      iVar4 = clock_getres(4,&local_b98);
      if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_bc8), iVar4 == 0)) {
        local_b88 = 0;
        local_ba8 = 0.0;
        dStack_ba0 = 0.0;
        local_bb8 = 0.0;
        dStack_bb0 = 0.0;
      }
      if (bPauseNortekDVL == 0) break;
      if (bVar2) {
        puts("NortekDVL paused.");
        iVar4 = CloseRS232Port(&local_a78.RS232Port);
        pcVar12 = "NortekDVL disconnection failed.";
        if (iVar4 == 0) {
          pcVar12 = "NortekDVL disconnected.";
        }
        puts(pcVar12);
      }
      if (bExit != 0) {
        bVar3 = true;
        goto LAB_001b61b1;
      }
      local_c18.inf = 0.0;
      local_c18.sup = 4.94065645841247e-316;
      bVar2 = false;
      nanosleep((timespec *)&local_c18,(timespec *)0x0);
    }
    if (bRestartNortekDVL != 0) {
      if (bVar2) {
        puts("Restarting a NortekDVL.");
        iVar4 = CloseRS232Port(&local_a78.RS232Port);
        pcVar12 = "NortekDVL disconnection failed.";
        if (iVar4 == 0) {
          pcVar12 = "NortekDVL disconnected.";
        }
        puts(pcVar12);
      }
      bRestartNortekDVL = 0;
      bVar2 = false;
    }
    if (bVar2) {
      iVar4 = GetNMEASentenceNortekDVL(&local_a78,&local_510);
      if (iVar4 == 0) {
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        if (((((local_a78.bEnable_PD6_SA != 0) || (local_a78.bEnable_PD6_TS != 0)) ||
             (local_a78.bEnable_PD6_BI != 0)) ||
            ((local_a78.bEnable_PD6_BS != 0 || (local_a78.bEnable_PD6_BE != 0)))) ||
           (local_a78.bEnable_PD6_BD != 0)) {
          if (local_a78.bEnable_PD6_SA != 0) {
            dVar1 = fmod((1.5707963267948966 - local_510.Heading) - angle_env,6.283185307179586);
            local_c28 = fmod(dVar1 + 9.42477796076938,6.283185307179586);
            local_c28 = local_c28 + -3.141592653589793;
            interval::interval(&local_bf8,&local_c28);
            local_c20 = -psi_ahrs_acc;
            interval::interval(&local_be0,&local_c20,&psi_ahrs_acc);
            operator+(&local_bf8,&local_be0);
            interval::operator=((interval *)&psi_ahrs,&local_c18);
            local_c28 = -local_510.Pitch;
            interval::interval(&local_bf8,&local_c28);
            local_c20 = -theta_ahrs_acc;
            interval::interval(&local_be0,&local_c20,&theta_ahrs_acc);
            operator+(&local_bf8,&local_be0);
            interval::operator=((interval *)&theta_ahrs,&local_c18);
            interval::interval(&local_bf8,&local_510.Roll);
            local_c28 = -phi_ahrs_acc;
            interval::interval(&local_be0,&local_c28,&phi_ahrs_acc);
            operator+(&local_bf8,&local_be0);
            interval::operator=((interval *)&phi_ahrs,&local_c18);
          }
          if (local_a78.bEnable_PD6_BS != 0) {
            if (local_510.vstatus_ship == 'V') {
              local_bf8.inf = -10000.0;
              local_be0.inf = 10000.0;
              interval::interval(&local_c18,&local_bf8.inf,&local_be0.inf);
              interval::operator=((interval *)&vrx_dvl,&local_c18);
              local_bf8.inf = -10000.0;
              local_be0.inf = 10000.0;
              interval::interval(&local_c18,&local_bf8.inf,&local_be0.inf);
              interval::operator=((interval *)&vry_dvl,&local_c18);
              local_bf8.inf = -10000.0;
              local_be0.inf = 10000.0;
              interval::interval(&local_c18,&local_bf8.inf,&local_be0.inf);
            }
            else {
              if (local_510.vstatus_ship != 'A') goto LAB_001b6041;
              interval::interval(&local_bf8,&local_510.vl_ship);
              local_c28 = -dvl_acc;
              interval::interval(&local_be0,&local_c28,&dvl_acc);
              operator+(&local_bf8,&local_be0);
              interval::operator=((interval *)&vrx_dvl,&local_c18);
              local_c28 = -local_510.vt_ship;
              interval::interval(&local_bf8,&local_c28);
              local_c20 = -dvl_acc;
              interval::interval(&local_be0,&local_c20,&dvl_acc);
              operator+(&local_bf8,&local_be0);
              interval::operator=((interval *)&vry_dvl,&local_c18);
              interval::interval(&local_bf8,&local_510.vn_ship);
              local_c28 = -dvl_acc;
              interval::interval(&local_be0,&local_c28,&dvl_acc);
              operator+(&local_bf8,&local_be0);
            }
            interval::operator=((interval *)&vrz_dvl,&local_c18);
          }
LAB_001b6041:
          if ((local_a78.bEnable_PD6_BE != 0) && (local_510.vstatus_earth == 'A')) {
            sog = local_510.SOG;
            dVar1 = fmod((1.5707963267948966 - local_510.COG) - angle_env,6.283185307179586);
            local_c28 = fmod(dVar1 + 9.42477796076938,6.283185307179586);
            local_c28 = local_c28 + -3.141592653589793;
            interval::interval(&local_bf8,&local_c28);
            local_c20 = -3.141592653589793;
            local_b80 = 3.141592653589793;
            interval::interval(&local_be0,&local_c20,&local_b80);
            operator+(&local_bf8,&local_be0);
            interval::operator=((interval *)&psi_dvl,&local_c18);
          }
          if ((local_a78.bEnable_PD6_BD != 0) && (local_510.timesincelastgood < 4.0)) {
            altitude_AGL = local_510.Altitude_AGL;
          }
        }
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        bVar2 = true;
        bVar3 = false;
      }
      else {
        puts("Connection to a NortekDVL lost.");
        iVar4 = CloseRS232Port(&local_a78.RS232Port);
        pcVar12 = "NortekDVL disconnection failed.";
        if (iVar4 == 0) {
          pcVar12 = "NortekDVL disconnected.";
        }
        puts(pcVar12);
        local_c18.inf = (double)((long)local_c00 / 1000);
        local_c18.sup = (double)(((long)local_c00 % 1000) * 1000000);
LAB_001b5b1e:
        bVar2 = false;
        nanosleep((timespec *)&local_c18,(timespec *)0x0);
        bVar3 = true;
      }
    }
    else {
      iVar4 = ConnectNortekDVL(&local_a78,"NortekDVL0.txt");
      if (iVar4 != 0) {
        local_c18.inf = 4.94065645841247e-324;
        local_c18.sup = 0.0;
        goto LAB_001b5b1e;
      }
      local_c00 = local_a78.threadperiod;
      memset(&local_510,0,0x3d8);
      if ((FILE *)local_a78.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_a78.pfSaveFile);
        local_a78.pfSaveFile = (FILE *)0x0;
      }
      bVar3 = false;
      bVar2 = true;
      if ((local_a78.bSaveRawData != 0) && ((FILE *)local_a78.pfSaveFile == (FILE *)0x0)) {
        if (local_a78.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_b78,"nortekdvl",10);
        }
        else {
          sprintf(local_b78,"%.127s",local_a78.szCfgFilePath);
        }
        sVar6 = strlen(local_b78);
        uVar5 = (uint)sVar6;
        uVar11 = sVar6 & 0xffffffff;
        uVar7 = (int)uVar5 >> 0x1f & uVar5;
        uVar10 = sVar6 & 0xffffffff;
        do {
          uVar11 = uVar11 - 1;
          uVar9 = (uint)uVar10;
          uVar10 = (ulong)(uVar7 - 1);
          uVar8 = uVar7;
          if ((int)uVar9 < 1) break;
          uVar10 = (ulong)(uVar9 - 1);
          uVar8 = uVar9;
        } while (local_b78[uVar11 & 0xffffffff] != '.');
        if ((int)uVar8 <= (int)uVar5 && 1 < (int)uVar8) {
          memset(local_b78 + uVar10,0,sVar6 - uVar10);
        }
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar12 = strtimeex_fns();
        bVar3 = false;
        sprintf(local_138,"log/%.127s_%.64s.txt",local_b78,pcVar12);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        local_a78.pfSaveFile = (FILE *)fopen(local_138,"wb");
        if ((FILE *)local_a78.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create NortekDVL data file.");
          bVar3 = false;
          goto LAB_001b61b1;
        }
      }
    }
    if ((bVar3) &&
       (local_bfc = local_bfc + 1, ExitOnErrorCount <= local_bfc && 0 < ExitOnErrorCount)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001b61b1:
      if (local_b88 == 0) {
        clock_gettime(4,(timespec *)&local_c18);
        local_bb8 = local_c18.inf;
        dStack_bb0 = local_c18.sup;
        local_c18.inf =
             (double)(((long)local_c18.inf + (long)local_ba8 +
                      ((long)local_c18.sup + (long)dStack_ba0) / 1000000000) - local_bc8.tv_sec);
        local_c18.sup =
             (double)(((long)local_c18.sup + (long)dStack_ba0) % 1000000000 - local_bc8.tv_nsec);
        if ((long)local_c18.sup < 0) {
          local_c18.inf = (double)((long)local_c18.inf + (long)local_c18.sup / 1000000000 + -1);
          local_c18.sup = (double)((long)local_c18.sup % 1000000000 + 1000000000);
        }
        local_ba8 = local_c18.inf;
        dStack_ba0 = local_c18.sup;
      }
      if ((FILE *)local_a78.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_a78.pfSaveFile);
        local_a78.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar3) {
        iVar4 = CloseRS232Port(&local_a78.RS232Port);
        if (iVar4 == 0) {
          __s = "NortekDVL disconnected.";
        }
        puts(__s);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE NortekDVLThread(void* pParam)
{
	NORTEKDVL nortekdvl;
	NMEADATA nmeadata;
	//double vrx = 0, vry = 0, vrz = 0, alt = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&nortekdvl, 0, sizeof(NORTEKDVL));

	memset(&nmeadata, 0, sizeof(nmeadata));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		//mSleep(threadperiod);

		if (bPauseNortekDVL)
		{
			if (bConnected)
			{
				printf("NortekDVL paused.\n");
				bConnected = FALSE;
				DisconnectNortekDVL(&nortekdvl);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartNortekDVL)
		{
			if (bConnected)
			{
				printf("Restarting a NortekDVL.\n");
				bConnected = FALSE;
				DisconnectNortekDVL(&nortekdvl);
			}
			bRestartNortekDVL = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectNortekDVL(&nortekdvl, "NortekDVL0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = nortekdvl.threadperiod;

				memset(&nmeadata, 0, sizeof(nmeadata));

				if (nortekdvl.pfSaveFile != NULL)
				{
					fclose(nortekdvl.pfSaveFile); 
					nortekdvl.pfSaveFile = NULL;
				}
				if ((nortekdvl.bSaveRawData)&&(nortekdvl.pfSaveFile == NULL)) 
				{
					if (strlen(nortekdvl.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", nortekdvl.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "nortekdvl");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					nortekdvl.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (nortekdvl.pfSaveFile == NULL) 
					{
						printf("Unable to create NortekDVL data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetNMEASentenceNortekDVL(&nortekdvl, &nmeadata) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);

				if (nortekdvl.bEnable_PD6_SA||nortekdvl.bEnable_PD6_TS||nortekdvl.bEnable_PD6_BI||nortekdvl.bEnable_PD6_BS||
					nortekdvl.bEnable_PD6_BE||nortekdvl.bEnable_PD6_BD)
				{
					if (nortekdvl.bEnable_PD6_SA)
					{
						psi_ahrs = fmod_2PI(M_PI/2.0-nmeadata.Heading-angle_env)+interval(-psi_ahrs_acc, psi_ahrs_acc);
						theta_ahrs = -nmeadata.Pitch+interval(-theta_ahrs_acc, theta_ahrs_acc);
						phi_ahrs = nmeadata.Roll+interval(-phi_ahrs_acc, phi_ahrs_acc);
					}

					if (nortekdvl.bEnable_PD6_BS)
					{
						if (nmeadata.vstatus_ship == 'A')
						{
							vrx_dvl = nmeadata.vl_ship+interval(-dvl_acc, dvl_acc);
							vry_dvl = -nmeadata.vt_ship+interval(-dvl_acc, dvl_acc);
							vrz_dvl = nmeadata.vn_ship+interval(-dvl_acc, dvl_acc);
						}
						else if (nmeadata.vstatus_ship == 'V')
						{
							vrx_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
							vry_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
							vrz_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
						}
					}

					if (nortekdvl.bEnable_PD6_BE)
					{
						if (nmeadata.vstatus_earth == 'A')
						{
							sog = nmeadata.SOG;
							psi_dvl = fmod_2PI(M_PI/2.0-nmeadata.COG-angle_env)+interval(-M_PI,M_PI);
						}
					}

					if (nortekdvl.bEnable_PD6_BD)
					{
						if (nmeadata.timesincelastgood < 4) altitude_AGL = nmeadata.Altitude_AGL;
					}
				}

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a NortekDVL lost.\n");
				bConnected = FALSE;
				DisconnectNortekDVL(&nortekdvl);
				mSleep(threadperiod);
			}
		}

		//printf("NortekDVLThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (nortekdvl.pfSaveFile != NULL)
	{
		fclose(nortekdvl.pfSaveFile); 
		nortekdvl.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectNortekDVL(&nortekdvl);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}